

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

Matrix * operator+(Matrix *__return_storage_ptr__,Matrix *m0,Matrix *m1)

{
  Matrix *this;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this = (Matrix *)operator_new(0x100);
  Matrix::Matrix(this,m0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80," + ",&local_81);
  std::operator+(&local_60,&m0->sMatrixName,&local_80);
  std::operator+(&local_40,&local_60,&m1->sMatrixName);
  std::__cxx11::string::operator=((string *)&this->sMatrixName,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  Matrix::operator+=(this,m1);
  Matrix::Matrix(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Matrix operator+(const Matrix &m0, const Matrix &m1)
{
	Matrix *m = new Matrix(m0);
	m->sMatrixName = m0.sMatrixName + string(" + ") + m1.sMatrixName;
	return m->operator+=( m1 );
}